

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  Value *type;
  StructDef *field;
  Definition *pDVar1;
  long lVar2;
  Type type_00;
  string *returnType;
  StructDef *pSVar3;
  long *plVar4;
  mapped_type *pmVar5;
  unsigned_long t;
  size_t t_00;
  long *plVar6;
  _Base_ptr p_Var7;
  CodeWriter *pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prefix;
  Type *type_01;
  EnumDef *pEVar9;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  char *__lhs;
  code *pcVar12;
  _Alloc_hider _Var13;
  BaseType BVar14;
  ulong uVar15;
  Type vectortype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  string params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string field_name;
  string return_type;
  string field_type;
  string offset_val;
  string field_default_value;
  FieldDef *key_field;
  string bbgetter;
  string ucast;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  undefined8 local_2e8;
  StructDef *pSStackY_2e0;
  EnumDef *local_2d8;
  undefined2 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd32;
  undefined2 in_stack_fffffffffffffd36;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffffd40;
  code *in_stack_fffffffffffffd48;
  _Alloc_hider local_2a8;
  StructDef *pSStack_2a0;
  undefined1 auStack_298 [16];
  _Any_data local_288;
  _Base_ptr local_278;
  _Base_ptr p_Stack_270;
  _Any_data local_268;
  undefined1 local_258 [8];
  undefined1 auStack_250 [24];
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  _Base_ptr local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  string local_1b8;
  IdlNamer *local_198;
  ulong local_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  StructDef *local_168;
  string local_160;
  undefined1 local_140 [32];
  uint local_120;
  uint local_11c;
  string local_118;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider _Stack_e0;
  StructDef *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_78 [2];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_168 = struct_def;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_68,&(struct_def->fields).vec);
  local_d8 = (StructDef *)0x0;
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_198 = &this->namer_;
    uVar11 = local_68.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    auStack_250._16_8_ = this;
    do {
      field = *(StructDef **)uVar11;
      if (field->fixed == false) {
        if (field->predecl == true) {
          local_d8 = field;
        }
        GenerateComment(this,&(field->super_Definition).doc_comment,writer,
                        (CommentConfig *)(anonymous_namespace)::comment_config);
        local_90._M_allocated_capacity = uVar11;
        (*(local_198->super_Namer)._vptr_Namer[0x12])(&local_1b8,local_198,field);
        uVar11 = auStack_250._16_8_;
        type = (Value *)&field->fields;
        GenTypeGet_abi_cxx11_(&local_160,(KotlinGenerator *)auStack_250._16_8_,(Type *)type);
        GenDefaultValue_abi_cxx11_(&local_118,(KotlinGenerator *)uVar11,(FieldDef *)field,false);
        GetterReturnType_abi_cxx11_
                  ((string *)&local_188,(KotlinGenerator *)uVar11,(FieldDef *)field);
        local_d0._M_allocated_capacity = (size_type)&local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bb","");
        ByteBufferGetter((string *)&local_b0,(KotlinGenerator *)auStack_250._16_8_,(Type *)type,
                         (string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_allocated_capacity != &local_c0) {
          operator_delete((void *)local_d0._M_allocated_capacity,local_c0._M_allocated_capacity + 1)
          ;
        }
        type_00._2_4_ = in_stack_fffffffffffffd32;
        type_00.base_type._0_2_ = in_stack_fffffffffffffd30;
        type_00.element._2_2_ = in_stack_fffffffffffffd36;
        type_00.struct_def = (StructDef *)in_stack_fffffffffffffd38;
        type_00.enum_def = (EnumDef *)in_stack_fffffffffffffd40;
        type_00._24_8_ = in_stack_fffffffffffffd48;
        CastToUsigned_abi_cxx11_(type_00);
        NumToString<unsigned_short>((string *)local_140,((Value *)&field->fields)->offset);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2e8,"val o = __offset(",(string *)local_140);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_1c8 = *plVar6;
          lStack_1c0 = plVar4[3];
          local_1d8 = &local_1c8;
        }
        else {
          local_1c8 = *plVar6;
          local_1d8 = (long *)*plVar4;
        }
        local_1d0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        BVar14 = (type->type).base_type;
        uVar15 = (ulong)BVar14;
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"offset","");
        NumToString<unsigned_short>((string *)&local_2a8,((Value *)&field->fields)->offset);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
          operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
        }
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"return_type","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"field_type","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"field_name","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"field_default","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"bbgetter","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        local_2e8 = (CodeWriter *)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"ucast","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,(key_type *)&local_2e8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_2e8 != (CodeWriter *)&local_2d8) {
          operator_delete(local_2e8,
                          (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1));
        }
        if (BVar14 == BASE_TYPE_VECTOR) {
          if ((((Value *)&field->fields)->type).element == BASE_TYPE_STRUCT) {
            local_2e8 = (CodeWriter *)&local_2d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"j: Int","");
            pSStack_2a0 = (StructDef *)0x0;
            auStack_298._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
                 ::_M_invoke;
            auStack_298._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
                 ::_M_manager;
            local_2a8._M_p = (pointer)writer;
            GenerateFunOneLine(writer,&local_1b8,(string *)&local_2e8,(string *)&local_188,
                               (function<void_()> *)&local_2a8,false);
            if ((EnumDef *)auStack_298._0_8_ != (EnumDef *)0x0) {
              (*(code *)auStack_298._0_8_)((string *)&local_2a8,(string *)&local_2a8,3);
            }
            if (local_2e8 != (CodeWriter *)&local_2d8) {
              operator_delete(local_2e8,
                              (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1
                                     ));
            }
          }
        }
        else if (BVar14 == BASE_TYPE_STRUCT) {
          pSStackY_2e0 = (StructDef *)0x0;
          in_stack_fffffffffffffd30 = 0x47f8;
          in_stack_fffffffffffffd32 = 0x1e;
          in_stack_fffffffffffffd36 = 0;
          local_2d8 = (EnumDef *)
                      std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:952:64)>
                      ::_M_manager;
          local_2e8 = writer;
          GenerateGetterOneLine
                    (writer,&local_1b8,(string *)&local_188,(function<void_()> *)&local_2e8);
          if (local_2d8 != (EnumDef *)0x0) {
            (*(code *)local_2d8)((Type *)&local_2e8,(Type *)&local_2e8,3);
          }
        }
        local_11c = BVar14 - BASE_TYPE_UTYPE;
        local_190 = uVar15;
        if (local_11c < 0xc) {
          if (local_168->fixed == true) {
            pSStackY_2e0 = (StructDef *)0x0;
            in_stack_fffffffffffffd30 = 0x49ac;
            in_stack_fffffffffffffd32 = 0x1e;
            in_stack_fffffffffffffd36 = 0;
            local_2d8 = (EnumDef *)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:967:66)>
                        ::_M_manager;
            local_2e8 = writer;
            GenerateGetterOneLine
                      (writer,&local_1b8,(string *)&local_188,(function<void_()> *)&local_2e8);
            if (local_2d8 != (EnumDef *)0x0) {
              (*(code *)local_2d8)((Type *)&local_2e8,(Type *)&local_2e8,3);
            }
          }
          else {
            pSStackY_2e0 = (StructDef *)0x0;
            in_stack_fffffffffffffd30 = 0x4a8c;
            in_stack_fffffffffffffd32 = 0x1e;
            in_stack_fffffffffffffd36 = 0;
            local_2d8 = (EnumDef *)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:971:59)>
                        ::_M_manager;
            local_2e8 = writer;
            GenerateGetter(writer,&local_1b8,(string *)&local_188,(function<void_()> *)&local_2e8);
            if (local_2d8 != (EnumDef *)0x0) {
              (*(code *)local_2d8)((Type *)&local_2e8,(Type *)&local_2e8,3);
            }
          }
        }
        else {
          switch(BVar14) {
          case BASE_TYPE_STRING:
            in_stack_fffffffffffffd30 = 0x5446;
            in_stack_fffffffffffffd32 = 0x1e;
            in_stack_fffffffffffffd36 = 0;
            local_2d8 = (EnumDef *)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1035:61)>
                        ::_M_manager;
            local_2e8 = writer;
            pSStackY_2e0 = field;
            GenerateGetter(writer,&local_1b8,(string *)&local_188,(function<void_()> *)&local_2e8);
            if (local_2d8 != (EnumDef *)0x0) {
              (*(code *)local_2d8)((Type *)&local_2e8,(Type *)&local_2e8,3);
            }
            goto LAB_001e135d;
          case BASE_TYPE_VECTOR:
            pSStackY_2e0 = (((Value *)&field->fields)->type).struct_def;
            local_2d8 = (EnumDef *)
                        (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            in_stack_fffffffffffffd30 =
                 *(undefined2 *)
                  &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2e8 = (CodeWriter *)(ulong)(((Value *)&field->fields)->type).element;
            local_2a8._M_p = (pointer)auStack_298;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"j: Int","");
            if ((BaseType)local_2e8 - BASE_TYPE_STRUCT < 2) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_288,"obj: ",&local_160);
              plVar4 = (long *)std::__cxx11::string::append(local_288._M_pod_data);
              p_Var7 = (_Base_ptr)(plVar4 + 2);
              if ((_Base_ptr)*plVar4 == p_Var7) {
                uVar11 = *(undefined8 *)p_Var7;
                uVar16 = (_Base_ptr)&stack0xfffffffffffffd48;
              }
              else {
                uVar11 = *(undefined8 *)p_Var7;
                uVar16 = (_Base_ptr)*plVar4;
              }
              *plVar4 = (long)p_Var7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__cxx11::string::operator=
                        ((string *)&local_2a8,(string *)&stack0xfffffffffffffd38);
              if ((_Base_ptr)uVar16 != (_Base_ptr)&stack0xfffffffffffffd48) {
                operator_delete((void *)uVar16,(ulong)(uVar11 + 1));
              }
              BVar14 = (BaseType)local_190;
              if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
                operator_delete(local_288._M_unused._M_object,
                                (ulong)((long)&local_278->_M_color + 1));
              }
            }
            in_stack_fffffffffffffd40 = (_Base_ptr)0x0;
            in_stack_fffffffffffffd38 = operator_new(0x20);
            *(Type **)&(((CodeWriter *)in_stack_fffffffffffffd38)->value_map_)._M_t._M_impl =
                 (Type *)&local_2e8;
            *(StructDef **)
             &(((CodeWriter *)in_stack_fffffffffffffd38)->value_map_)._M_t._M_impl.
              super__Rb_tree_header._M_header = field;
            (((CodeWriter *)in_stack_fffffffffffffd38)->value_map_)._M_t._M_impl.
            super__Rb_tree_header._M_header._M_parent = (_Base_ptr)writer;
            (((CodeWriter *)in_stack_fffffffffffffd38)->value_map_)._M_t._M_impl.
            super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_140;
            in_stack_fffffffffffffd48 =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1073:66)>
                 ::_M_manager;
            GenerateFun(writer,&local_1b8,(string *)&local_2a8,(string *)&local_188,
                        (function<void_()> *)&stack0xfffffffffffffd38,false);
            if ((_Base_ptr)in_stack_fffffffffffffd48 != (_Base_ptr)0x0) {
              (*in_stack_fffffffffffffd48)(&stack0xfffffffffffffd38,&stack0xfffffffffffffd38,3);
            }
            pEVar9 = (EnumDef *)auStack_298._0_8_;
            _Var13._M_p = local_2a8._M_p;
            if ((CodeWriter *)local_2a8._M_p == (CodeWriter *)auStack_298) goto LAB_001e135d;
            goto LAB_001e1355;
          case BASE_TYPE_STRUCT:
            if (local_168->fixed == true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2e8,"obj: ",&local_160);
              pSStack_2a0 = (StructDef *)0x0;
              auStack_298._8_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
                   ::_M_invoke;
              auStack_298._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
                   ::_M_manager;
              local_2a8._M_p = (pointer)writer;
              GenerateFunOneLine(writer,&local_1b8,(string *)&local_2e8,(string *)&local_188,
                                 (function<void_()> *)&local_2a8,false);
              if ((EnumDef *)auStack_298._0_8_ != (EnumDef *)0x0) {
                (*(code *)auStack_298._0_8_)((string *)&local_2a8,(string *)&local_2a8,3);
              }
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2e8,"obj: ",&local_160);
              auStack_298._0_8_ = 0;
              auStack_298._8_8_ = 0;
              local_2a8._M_p = (pointer)0x0;
              pSStack_2a0 = (StructDef *)0x0;
              local_2a8._M_p = (pointer)operator_new(0x18);
              *(StructDef **)&(((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl = field;
              *(CodeWriter **)
               &(((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
                _M_header = writer;
              (((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_parent = (_Base_ptr)local_140;
              auStack_298._8_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1003:74)>
                   ::_M_invoke;
              auStack_298._0_8_ =
                   std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1003:74)>
                   ::_M_manager;
              GenerateFun(writer,&local_1b8,(string *)&local_2e8,(string *)&local_188,
                          (function<void_()> *)&local_2a8,false);
              if ((EnumDef *)auStack_298._0_8_ != (EnumDef *)0x0) {
                (*(code *)auStack_298._0_8_)((string *)&local_2a8,(string *)&local_2a8,3);
              }
            }
            break;
          case BASE_TYPE_UNION:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2e8,"obj: ",&local_160);
            auStack_298._0_8_ = 0;
            auStack_298._8_8_ = 0;
            local_2a8._M_p = (pointer)0x0;
            pSStack_2a0 = (StructDef *)0x0;
            local_2a8._M_p = (pointer)operator_new(0x18);
            *(CodeWriter **)&(((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl = writer;
            *(_Alloc_hider **)
             &(((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
              _M_header = (_Alloc_hider *)local_140;
            (((CodeWriter *)local_2a8._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent = (_Base_ptr)&local_b0;
            auStack_298._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1103:72)>
                 ::_M_invoke;
            auStack_298._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1103:72)>
                 ::_M_manager;
            GenerateFun(writer,&local_1b8,(string *)&local_2e8,(string *)&local_188,
                        (function<void_()> *)&local_2a8,false);
            if ((EnumDef *)auStack_298._0_8_ != (EnumDef *)0x0) {
              (*(code *)auStack_298._0_8_)((string *)&local_2a8,(string *)&local_2a8,3);
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp"
                          ,0x454,
                          "void flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                         );
          }
          pEVar9 = local_2d8;
          _Var13._M_p = (pointer)local_2e8;
          if (local_2e8 != (CodeWriter *)&local_2d8) {
LAB_001e1355:
            operator_delete(_Var13._M_p,
                            (ulong)((long)&(pEVar9->super_Definition).name._M_dataplus._M_p + 1));
          }
        }
LAB_001e135d:
        if (BVar14 == BASE_TYPE_VECTOR) {
          local_2e8 = (CodeWriter *)&local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e8,local_1b8._M_dataplus._M_p,
                     local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
          std::__cxx11::string::append((char *)&local_2e8);
          local_2a8._M_p = (pointer)auStack_298;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Int","");
          in_stack_fffffffffffffd40 = local_140;
          in_stack_fffffffffffffd48 =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1114:62)>
               ::_M_manager;
          in_stack_fffffffffffffd38 = writer;
          GenerateGetter(writer,(string *)&local_2e8,(string *)&local_2a8,
                         (function<void_()> *)&stack0xfffffffffffffd38);
          if ((_Base_ptr)in_stack_fffffffffffffd48 != (_Base_ptr)0x0) {
            (*in_stack_fffffffffffffd48)
                      ((function<void_()> *)&stack0xfffffffffffffd38,
                       (function<void_()> *)&stack0xfffffffffffffd38,3);
          }
          if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
            operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
          }
          if (local_2e8 != (CodeWriter *)&local_2d8) {
            operator_delete(local_2e8,
                            (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1))
            ;
          }
          if ((*(int *)&(field->fields).dict._M_t._M_impl.field_0x4 == 0xf) &&
             (pDVar1 = *(Definition **)
                        &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header,
             *(char *)&pDVar1[1].doc_comment.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish == '\0')) {
            for (plVar4 = (long *)pDVar1[1].file.field_2._M_allocated_capacity;
                plVar4 != *(long **)((long)&pDVar1[1].file.field_2 + 8); plVar4 = plVar4 + 1) {
              lVar2 = *plVar4;
              if (*(char *)(lVar2 + 0x111) == '\x01') {
                local_2a8._M_p = auStack_298;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
                BaseGenerator::WrapInNameSpace
                          ((string *)&local_2e8,(BaseGenerator *)auStack_250._16_8_,pDVar1,
                           (string *)&local_2a8);
                if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
                  operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
                }
                uVar11 = &stack0xfffffffffffffd48;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffd38,"ByKey","");
                (*(local_198->super_Namer)._vptr_Namer[3])
                          ((string *)&local_2a8,local_198,field,(string *)&stack0xfffffffffffffd38);
                if ((_Base_ptr)uVar11 != (_Base_ptr)&stack0xfffffffffffffd48) {
                  operator_delete((void *)uVar11,(ulong)((long)in_stack_fffffffffffffd48 + 1));
                }
                type_01 = (Type *)(lVar2 + 200);
                GenTypeGet_abi_cxx11_
                          ((string *)&local_288,(KotlinGenerator *)auStack_250._16_8_,type_01);
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_288,0,(char *)0x0,0x3706a2);
                in_stack_fffffffffffffd38 = &stack0xfffffffffffffd48;
                pCVar8 = (CodeWriter *)(plVar4 + 2);
                if ((CodeWriter *)*plVar4 == pCVar8) {
                  in_stack_fffffffffffffd48 = *(code **)&(pCVar8->value_map_)._M_t._M_impl;
                }
                else {
                  in_stack_fffffffffffffd48 = *(code **)&(pCVar8->value_map_)._M_t._M_impl;
                  in_stack_fffffffffffffd38 = (CodeWriter *)*plVar4;
                }
                in_stack_fffffffffffffd40 = plVar4[1];
                *plVar4 = (long)pCVar8;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
                  operator_delete(local_288._M_unused._M_object,
                                  (ulong)((long)&local_278->_M_color + 1));
                }
                local_288._M_unused._M_object = &local_278;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_288,local_2e8,
                           (long)&(pSStackY_2e0->super_Definition).name._M_dataplus._M_p +
                           (long)local_2e8);
                std::__cxx11::string::append(local_288._M_pod_data);
                local_258 = (undefined1  [8])0x0;
                auStack_250._0_8_ = 0;
                local_268._M_unused._M_object = (_Base_ptr)0x0;
                local_268._8_8_ = (_Base_ptr)0x0;
                local_268._M_unused._M_object = operator_new(0x18);
                *(CodeWriter **)local_268._M_unused._0_8_ = writer;
                ((_Base_ptr)local_268._M_unused._0_8_)->_M_parent = (_Base_ptr)local_140;
                ((_Base_ptr)local_268._M_unused._0_8_)->_M_left = (_Base_ptr)&local_2e8;
                auStack_250._0_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1130:56)>
                     ::_M_invoke;
                local_258 = (undefined1  [8])
                            std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1130:56)>
                            ::_M_manager;
                GenerateFun(writer,(string *)&local_2a8,(string *)&stack0xfffffffffffffd38,
                            (string *)&local_288,(function<void_()> *)&local_268,false);
                if (local_258 != (undefined1  [8])0x0) {
                  (*(code *)local_258)(&local_268,&local_268,3);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_228 + 0x10),"obj: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2e8);
                plVar4 = (long *)std::__cxx11::string::append((char *)(local_228 + 0x10));
                local_238._0_8_ = local_228;
                p_Var7 = (_Base_ptr)(plVar4 + 2);
                if ((_Base_ptr)*plVar4 == p_Var7) {
                  local_228._0_8_ = *(undefined8 *)p_Var7;
                  local_228._8_8_ = plVar4[3];
                }
                else {
                  local_228._0_8_ = *(undefined8 *)p_Var7;
                  local_238._0_8_ = (_Base_ptr)*plVar4;
                }
                local_238._8_8_ = plVar4[1];
                *plVar4 = (long)p_Var7;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                GenTypeGet_abi_cxx11_
                          ((string *)&local_1f8,(KotlinGenerator *)auStack_250._16_8_,type_01);
                pcVar12 = (code *)0xf;
                if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)local_228) {
                  pcVar12 = (code *)local_228._0_8_;
                }
                if (pcVar12 < (code *)(local_1f8._8_8_ + local_238._8_8_)) {
                  pcVar12 = (code *)0xf;
                  if ((code **)local_1f8._M_unused._0_8_ != &local_1e8) {
                    pcVar12 = local_1e8;
                  }
                  if (pcVar12 < (code *)(local_1f8._8_8_ + local_238._8_8_)) goto LAB_001e27a8;
                  plVar4 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_1f8,0,(char *)0x0,local_238._0_8_);
                }
                else {
LAB_001e27a8:
                  plVar4 = (long *)std::__cxx11::string::_M_append
                                             (auStack_250 + 0x18,
                                              local_1f8._M_unused._M_member_pointer);
                }
                local_268._M_unused._M_object = local_258;
                pCVar8 = (CodeWriter *)(plVar4 + 2);
                if ((CodeWriter *)*plVar4 == pCVar8) {
                  local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
                  auStack_250._0_8_ = plVar4[3];
                }
                else {
                  local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
                  local_268._M_unused._M_object = (CodeWriter *)*plVar4;
                }
                local_268._8_8_ = plVar4[1];
                *plVar4 = (long)pCVar8;
                plVar4[1] = 0;
                *(undefined1 *)&(pCVar8->value_map_)._M_t._M_impl = 0;
                if ((code **)local_1f8._M_unused._0_8_ != &local_1e8) {
                  operator_delete(local_1f8._M_unused._M_object,(ulong)(local_1e8 + 1));
                }
                if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)local_228) {
                  operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._16_8_ != &local_208) {
                  operator_delete((void *)local_228._16_8_,
                                  (ulong)(local_208._M_allocated_capacity + 1));
                }
                local_228._0_8_ = 0;
                local_228._8_8_ = (_Base_ptr)0x0;
                local_238._0_8_ = (_Base_ptr)0x0;
                local_238._8_8_ = 0;
                local_238._0_8_ = operator_new(0x18);
                *(CodeWriter **)local_238._0_8_ = writer;
                ((_Base_ptr)local_238._0_8_)->_M_parent = (_Base_ptr)local_140;
                ((_Base_ptr)local_238._0_8_)->_M_left = (_Base_ptr)&local_2e8;
                local_228._8_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1142:56)>
                     ::_M_invoke;
                local_228._0_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1142:56)>
                     ::_M_manager;
                GenerateFun(writer,(string *)&local_2a8,(string *)&local_268,(string *)&local_288,
                            (function<void_()> *)(auStack_250 + 0x18),false);
                if ((code *)local_228._0_8_ != (code *)0x0) {
                  (*(code *)local_228._0_8_)(auStack_250 + 0x18,auStack_250 + 0x18,3);
                }
                if ((CodeWriter *)local_268._M_unused._0_8_ != (CodeWriter *)local_258) {
                  operator_delete(local_268._M_unused._M_object,(ulong)((long)local_258 + 1));
                }
                if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
                  operator_delete(local_288._M_unused._M_object,
                                  (ulong)((long)&local_278->_M_color + 1));
                }
                if ((CodeWriter *)in_stack_fffffffffffffd38 !=
                    (CodeWriter *)&stack0xfffffffffffffd48) {
                  operator_delete((void *)in_stack_fffffffffffffd38,
                                  (ulong)((long)in_stack_fffffffffffffd48 + 1));
                }
                if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
                  operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
                }
                if (local_2e8 != (CodeWriter *)&local_2d8) {
                  operator_delete(local_2e8,
                                  (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p
                                         + 1));
                }
                break;
              }
            }
          }
          if (*(int *)&(field->fields).dict._M_t._M_impl.field_0x4 - 1U < 0xc) {
LAB_001e149c:
            t = 1;
            if ((int)local_190 != 0xd) {
              pSStack_2a0 = *(StructDef **)
                             &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header;
              auStack_298._0_8_ =
                   (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_2a8._M_p._4_4_ = 0;
              local_2a8._M_p._0_4_ = *(uint *)&(field->fields).dict._M_t._M_impl.field_0x4;
              auStack_298._8_2_ =
                   *(undefined2 *)
                    &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              t = InlineSize((Type *)&local_2a8);
            }
            NumToString<unsigned_long>((string *)&local_2e8,t);
            local_2a8._M_p = (pointer)auStack_298;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a8,local_1b8._M_dataplus._M_p,
                       local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
            std::__cxx11::string::append((char *)&local_2a8);
            uVar11 = &stack0xfffffffffffffd48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffd38,"ByteBuffer","");
            p_Stack_270 = (_Base_ptr)
                          std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
                          ::_M_invoke;
            local_278 = (_Base_ptr)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
                        ::_M_manager;
            local_288._M_unused._M_object = writer;
            local_288._8_8_ = (Type *)&local_2e8;
            GenerateGetterOneLine
                      (writer,(string *)&local_2a8,(string *)&stack0xfffffffffffffd38,
                       (function<void_()> *)&local_288);
            if (local_278 != (_Base_ptr)0x0) {
              (*(code *)local_278)(&local_288,&local_288,3);
            }
            if ((_Base_ptr)uVar11 != (_Base_ptr)&stack0xfffffffffffffd48) {
              operator_delete((void *)uVar11,(ulong)((long)in_stack_fffffffffffffd48 + 1));
            }
            if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
              operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
            }
            local_2a8._M_p = (pointer)auStack_298;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a8,local_1b8._M_dataplus._M_p,
                       local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
            std::__cxx11::string::append((char *)&local_2a8);
            in_stack_fffffffffffffd38 = &stack0xfffffffffffffd48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffd38,"_bb: ByteBuffer","");
            local_288._M_unused._M_object = &local_278;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"ByteBuffer","");
            auStack_250._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
                 ::_M_invoke;
            local_258 = (undefined1  [8])
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
                        ::_M_manager;
            local_268._M_unused._M_object = writer;
            local_268._8_8_ = (Type *)&local_2e8;
            GenerateFunOneLine(writer,(string *)&local_2a8,(string *)&stack0xfffffffffffffd38,
                               (string *)&local_288,(function<void_()> *)&local_268,false);
            if (local_258 != (undefined1  [8])0x0) {
              (*(code *)local_258)(&local_268,&local_268,3);
            }
            if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
              operator_delete(local_288._M_unused._M_object,(ulong)((long)&local_278->_M_color + 1))
              ;
            }
            if ((CodeWriter *)in_stack_fffffffffffffd38 != (CodeWriter *)&stack0xfffffffffffffd48) {
              operator_delete((void *)in_stack_fffffffffffffd38,
                              (ulong)((long)in_stack_fffffffffffffd48 + 1));
            }
            if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
              operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
            }
            if (local_2e8 != (CodeWriter *)&local_2d8) {
              operator_delete(local_2e8,
                              (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1
                                     ));
            }
          }
        }
        else if (BVar14 == BASE_TYPE_STRING) goto LAB_001e149c;
        pDVar1 = (Definition *)field->bytesize;
        if (pDVar1 != (Definition *)0x0) {
          local_2a8._M_p = (pointer)auStack_298;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
          BaseGenerator::WrapInNameSpace
                    ((string *)&local_2e8,(BaseGenerator *)auStack_250._16_8_,pDVar1,
                     (string *)&local_2a8);
          if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
            operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
          }
          uVar11 = &stack0xfffffffffffffd48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffd38,local_1b8._M_dataplus._M_p,
                     local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
          std::__cxx11::string::append((char *)&stack0xfffffffffffffd38);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&stack0xfffffffffffffd38,*(ulong *)field->bytesize);
          pCVar8 = (CodeWriter *)(plVar4 + 2);
          if ((CodeWriter *)*plVar4 == pCVar8) {
            auStack_298._0_8_ = *(undefined8 *)&(pCVar8->value_map_)._M_t._M_impl;
            auStack_298._8_8_ = plVar4[3];
            local_2a8._M_p = (pointer)auStack_298;
          }
          else {
            auStack_298._0_8_ = *(undefined8 *)&(pCVar8->value_map_)._M_t._M_impl;
            local_2a8._M_p = (pointer)*plVar4;
          }
          pSStack_2a0 = (StructDef *)plVar4[1];
          *plVar4 = (long)pCVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((_Base_ptr)uVar11 != (_Base_ptr)&stack0xfffffffffffffd48) {
            operator_delete((void *)uVar11,(ulong)((long)in_stack_fffffffffffffd48 + 1));
          }
          in_stack_fffffffffffffd38 = &stack0xfffffffffffffd48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffd38,local_2e8,
                     (long)&(pSStackY_2e0->super_Definition).name._M_dataplus._M_p + (long)local_2e8
                    );
          std::__cxx11::string::append((char *)&stack0xfffffffffffffd38);
          local_278 = (_Base_ptr)0x0;
          p_Stack_270 = (_Base_ptr)0x0;
          local_288._M_unused._M_object = (_Base_ptr)0x0;
          local_288._8_8_ = (Type *)0x0;
          local_288._M_unused._M_object = operator_new(0x18);
          *(CodeWriter **)local_288._M_unused._0_8_ = writer;
          ((_Base_ptr)local_288._M_unused._0_8_)->_M_parent = (_Base_ptr)&local_2a8;
          ((_Base_ptr)local_288._M_unused._0_8_)->_M_left = (_Base_ptr)&local_2e8;
          p_Stack_270 = (_Base_ptr)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1198:65)>
                        ::_M_invoke;
          local_278 = (_Base_ptr)
                      std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1198:65)>
                      ::_M_manager;
          GenerateGetterOneLine
                    (writer,(string *)&local_2a8,(string *)&stack0xfffffffffffffd38,
                     (function<void_()> *)&local_288);
          if (local_278 != (_Base_ptr)0x0) {
            (*(code *)local_278)(&local_288,&local_288,3);
          }
          if ((CodeWriter *)in_stack_fffffffffffffd38 != (CodeWriter *)&stack0xfffffffffffffd48) {
            operator_delete((void *)in_stack_fffffffffffffd38,
                            (ulong)((long)in_stack_fffffffffffffd48 + 1));
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffd38,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2e8);
          local_288._M_unused._M_object = &local_278;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,local_2e8,
                     (long)&(pSStackY_2e0->super_Definition).name._M_dataplus._M_p + (long)local_2e8
                    );
          std::__cxx11::string::append(local_288._M_pod_data);
          local_268._8_8_ = local_140;
          auStack_250._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
               ::_M_invoke;
          local_258 = (undefined1  [8])
                      std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
                      ::_M_manager;
          local_268._M_unused._M_object = writer;
          GenerateFun(writer,(string *)&local_2a8,(string *)&stack0xfffffffffffffd38,
                      (string *)&local_288,(function<void_()> *)&local_268,false);
          if (local_258 != (undefined1  [8])0x0) {
            (*(code *)local_258)(&local_268,&local_268,3);
          }
          if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
            operator_delete(local_288._M_unused._M_object,(ulong)((long)&local_278->_M_color + 1));
          }
          if ((CodeWriter *)in_stack_fffffffffffffd38 != (CodeWriter *)&stack0xfffffffffffffd48) {
            operator_delete((void *)in_stack_fffffffffffffd38,
                            (ulong)((long)in_stack_fffffffffffffd48 + 1));
          }
          if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
            operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
          }
          if (local_2e8 != (CodeWriter *)&local_2d8) {
            operator_delete(local_2e8,
                            (ulong)((long)&(local_2d8->super_Definition).name._M_dataplus._M_p + 1))
            ;
          }
        }
        prefix = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffd38;
        this = (KotlinGenerator *)auStack_250._16_8_;
        if ((((BaseGenerator *)auStack_250._16_8_)->parser_->opts).mutable_buffer == true) {
          local_120 = *(uint *)&(field->fields).dict._M_t._M_impl.field_0x4;
          pSStackY_2e0 = *(StructDef **)
                          &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header;
          local_2d8 = (EnumDef *)
                      (field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          in_stack_fffffffffffffd30 =
               *(undefined2 *)
                &(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((int)local_190 == 0xe) {
            local_2e8 = (CodeWriter *)(ulong)local_120;
          }
          else {
            local_2e8 = (CodeWriter *)
                        CONCAT44(local_120,*(undefined4 *)&(field->fields).dict._M_t._M_impl);
            in_stack_fffffffffffffd36 =
                 *(undefined2 *)
                  ((long)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                  + 6);
            in_stack_fffffffffffffd32 =
                 *(undefined4 *)
                  ((long)&(field->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                  + 2);
          }
          in_stack_fffffffffffffd38 = &stack0xfffffffffffffd48;
          std::__cxx11::string::_M_construct<char_const*>((string *)prefix,"mutate","");
          local_288._M_unused._M_object = &local_278;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
          IdlNamer::LegacyKotlinMethod
                    ((string *)&local_2a8,local_198,prefix,(FieldDef *)field,(string *)&local_288);
          if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
            operator_delete(local_288._M_unused._M_object,(ulong)((long)&local_278->_M_color + 1));
          }
          if ((CodeWriter *)in_stack_fffffffffffffd38 != (CodeWriter *)&stack0xfffffffffffffd48) {
            operator_delete((void *)in_stack_fffffffffffffd38,
                            (ulong)((long)in_stack_fffffffffffffd48 + 1));
          }
          t_00 = InlineSize((Type *)&local_2e8);
          NumToString<unsigned_long>(prefix,t_00);
          (*(local_198->super_Namer)._vptr_Namer[0x12])(auStack_250 + 0x18,local_198,field);
          plVar4 = (long *)std::__cxx11::string::append(auStack_250 + 0x18);
          pCVar8 = (CodeWriter *)(plVar4 + 2);
          if ((CodeWriter *)*plVar4 == pCVar8) {
            local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
            auStack_250._0_8_ = plVar4[3];
            local_268._M_unused._M_object = (CodeWriter *)local_258;
          }
          else {
            local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
            local_268._M_unused._M_object = (CodeWriter *)*plVar4;
          }
          local_268._8_8_ = plVar4[1];
          *plVar4 = (long)pCVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          GenTypeGet_abi_cxx11_
                    ((string *)(local_228 + 0x10),(KotlinGenerator *)auStack_250._16_8_,
                     (Type *)&local_2e8);
          auVar10 = (undefined1  [8])(code *)0xf;
          if ((CodeWriter *)local_268._M_unused._0_8_ != (CodeWriter *)local_258) {
            auVar10 = local_258;
          }
          pcVar12 = (code *)((long)&local_210->_M_color + local_268._8_8_);
          if ((ulong)auVar10 < pcVar12) {
            uVar11 = (code *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._16_8_ != &local_208) {
              uVar11 = local_208._M_allocated_capacity;
            }
            if ((ulong)uVar11 < pcVar12) goto LAB_001e1cff;
            plVar4 = (long *)std::__cxx11::string::replace
                                       ((ulong)(local_228 + 0x10),0,(char *)0x0,
                                        local_268._M_unused._M_member_pointer);
          }
          else {
LAB_001e1cff:
            plVar4 = (long *)std::__cxx11::string::_M_append(local_268._M_pod_data,local_228._16_8_)
            ;
          }
          local_288._M_unused._M_object = &local_278;
          p_Var7 = (_Base_ptr)(plVar4 + 2);
          if ((_Base_ptr)*plVar4 == p_Var7) {
            local_278 = *(_Base_ptr *)p_Var7;
            p_Stack_270 = (_Base_ptr)plVar4[3];
          }
          else {
            local_278 = *(_Base_ptr *)p_Var7;
            local_288._M_unused._M_object = (_Base_ptr)*plVar4;
          }
          local_288._8_8_ = plVar4[1];
          *plVar4 = (long)p_Var7;
          plVar4[1] = 0;
          *(undefined1 *)&p_Var7->_M_color = _S_red;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._16_8_ != &local_208) {
            operator_delete((void *)local_228._16_8_,(ulong)(local_208._M_allocated_capacity + 1));
          }
          if ((CodeWriter *)local_268._M_unused._0_8_ != (CodeWriter *)local_258) {
            operator_delete(local_268._M_unused._M_object,(ulong)((long)local_258 + 1));
          }
          uVar15 = local_190;
          if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)local_228) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
          }
          if ((int)uVar15 == 0xe) {
            std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0x3706c9);
          }
          BVar14 = (BaseType)local_2e8;
          if ((BaseType)local_2e8 == BASE_TYPE_BOOL) {
            (*(local_198->super_Namer)._vptr_Namer[0x12])(local_50,local_198,field);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3706d2);
            local_f8 = local_f0._M_local_buf + 8;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_f0._8_8_ = *plVar6;
              _Stack_e0._M_p = (pointer)plVar4[3];
            }
            else {
              local_f0._8_8_ = *plVar6;
              local_f8 = (char *)*plVar4;
            }
            local_f0._M_allocated_capacity = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_268._M_unused._M_object = local_258;
            pCVar8 = (CodeWriter *)(plVar4 + 2);
            if ((CodeWriter *)*plVar4 == pCVar8) {
              local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
              auStack_250._0_8_ = plVar4[3];
            }
            else {
              local_258 = *(undefined1 (*) [8])&(pCVar8->value_map_)._M_t._M_impl;
              local_268._M_unused._M_object = (CodeWriter *)*plVar4;
            }
            local_268._8_8_ = plVar4[1];
            *plVar4 = (long)pCVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
          }
          else {
            (*(local_198->super_Namer)._vptr_Namer[0x12])(&local_268,local_198,field);
          }
          if (BVar14 == BASE_TYPE_BOOL) {
            if (local_f8 != local_f0._M_local_buf + 8) {
              operator_delete(local_f8,local_f0._8_8_ + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          __lhs = "__vector(o) + j * ";
          if ((int)local_190 == 0xe) {
LAB_001e1ff1:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_250 + 0x18),__lhs,prefix);
          }
          else {
            __lhs = "bb_pos + ";
            prefix = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
            if (local_168->fixed == true) goto LAB_001e1ff1;
            local_238._0_8_ = local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(auStack_250 + 0x18),"o + bb_pos","");
          }
          pSVar3 = local_168;
          returnType = (string *)(local_228 + 0x10);
          if ((local_11c < 0xc) || (local_120 - 1 < 0xc && (int)local_190 == 0xe)) {
            if (local_168->fixed == true) {
              local_228._16_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>((string *)returnType,"ByteBuffer","");
              uVar11 = auStack_250._16_8_;
              local_1e8 = (code *)0x0;
              pcStack_1e0 = (code *)0x0;
              local_1f8._M_unused._M_object = (void *)0x0;
              local_1f8._8_8_ = 0;
              local_1f8._M_unused._M_object = operator_new(0x40);
              *(CodeWriter **)local_1f8._M_unused._0_8_ = writer;
              *(undefined8 *)((long)local_1f8._M_unused._0_8_ + 8) = uVar11;
              *(undefined8 **)((long)local_1f8._M_unused._0_8_ + 0x10) = &local_2e8;
              *(undefined1 **)((long)local_1f8._M_unused._0_8_ + 0x18) = auStack_250 + 0x18;
              *(_Any_data **)((long)local_1f8._M_unused._0_8_ + 0x20) = &local_268;
              *(StructDef **)((long)local_1f8._M_unused._0_8_ + 0x28) = field;
              *(StructDef **)((long)local_1f8._M_unused._0_8_ + 0x30) = pSVar3;
              *(_Alloc_hider **)((long)local_1f8._M_unused._0_8_ + 0x38) = (_Alloc_hider *)local_140
              ;
              pcStack_1e0 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_invoke;
              local_1e8 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                          ::_M_manager;
              GenerateFunOneLine(writer,(string *)&local_2a8,(string *)&local_288,returnType,
                                 (function<void_()> *)&local_1f8,false);
              if (local_1e8 != (code *)0x0) {
                (*local_1e8)(&local_1f8,&local_1f8,3);
              }
            }
            else {
              local_228._16_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>((string *)returnType,"Boolean","");
              uVar11 = auStack_250._16_8_;
              local_1e8 = (code *)0x0;
              pcStack_1e0 = (code *)0x0;
              local_1f8._M_unused._M_object = (void *)0x0;
              local_1f8._8_8_ = 0;
              local_1f8._M_unused._M_object = operator_new(0x40);
              *(CodeWriter **)local_1f8._M_unused._0_8_ = writer;
              *(undefined8 *)((long)local_1f8._M_unused._0_8_ + 8) = uVar11;
              *(undefined8 **)((long)local_1f8._M_unused._0_8_ + 0x10) = &local_2e8;
              *(undefined1 **)((long)local_1f8._M_unused._0_8_ + 0x18) = auStack_250 + 0x18;
              *(_Any_data **)((long)local_1f8._M_unused._0_8_ + 0x20) = &local_268;
              *(StructDef **)((long)local_1f8._M_unused._0_8_ + 0x28) = field;
              *(StructDef **)((long)local_1f8._M_unused._0_8_ + 0x30) = pSVar3;
              *(_Alloc_hider **)((long)local_1f8._M_unused._0_8_ + 0x38) = (_Alloc_hider *)local_140
              ;
              pcStack_1e0 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                            ::_M_invoke;
              local_1e8 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1241:29)>
                          ::_M_manager;
              GenerateFun(writer,(string *)&local_2a8,(string *)&local_288,returnType,
                          (function<void_()> *)&local_1f8,false);
              if (local_1e8 != (code *)0x0) {
                (*local_1e8)(&local_1f8,&local_1f8,3);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._16_8_ != &local_208) {
              operator_delete((void *)local_228._16_8_,(ulong)(local_208._M_allocated_capacity + 1))
              ;
            }
          }
          if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)local_228) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
          }
          if ((CodeWriter *)local_268._M_unused._0_8_ != (CodeWriter *)local_258) {
            operator_delete(local_268._M_unused._M_object,(ulong)((long)local_258 + 1));
          }
          if ((_Base_ptr)local_288._M_unused._0_8_ != (_Base_ptr)&local_278) {
            operator_delete(local_288._M_unused._M_object,(ulong)((long)&local_278->_M_color + 1));
          }
          if ((CodeWriter *)in_stack_fffffffffffffd38 != (CodeWriter *)&stack0xfffffffffffffd48) {
            operator_delete((void *)in_stack_fffffffffffffd38,
                            (ulong)((long)in_stack_fffffffffffffd48 + 1));
          }
          this = (KotlinGenerator *)auStack_250._16_8_;
          if ((CodeWriter *)local_2a8._M_p != (CodeWriter *)auStack_298) {
            operator_delete(local_2a8._M_p,(ulong)(auStack_298._0_8_ + 1));
          }
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        uVar11 = local_90._M_allocated_capacity;
        if ((_Alloc_hider *)local_140._0_8_ != (_Alloc_hider *)(local_140 + 0x10)) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        if ((long *)local_90._8_8_ != local_78) {
          operator_delete((void *)local_90._8_8_,local_78[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        }
        if ((code **)local_188._M_unused._0_8_ != &local_178) {
          operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar11 = uVar11 + 8;
    } while ((pointer)uVar11 !=
             local_68.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((local_168->has_key != false) && (local_168->fixed == false)) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"keysCompare","");
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"o1: Int, o2: Int, _bb: ByteBuffer","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Int","");
    local_178 = (code *)0x0;
    pcStack_170 = (code *)0x0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    local_188._M_unused._M_object = operator_new(0x18);
    *(StructDef ***)local_188._M_unused._0_8_ = &local_d8;
    *(CodeWriter **)((long)local_188._M_unused._0_8_ + 8) = writer;
    *(KotlinGenerator **)((long)local_188._M_unused._0_8_ + 0x10) = this;
    pcStack_170 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1271:11)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1271:11)>
                ::_M_manager;
    GenerateOverrideFun(writer,&local_1b8,&local_160,&local_118,(function<void_()> *)&local_188);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto ucast = CastToUsigned(field);
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = __offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      writer.SetValue("ucast", ucast);

      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            writer += "{{bbgetter}}(bb_pos + {{offset}}){{ucast}}";
          });
        } else {
          GenerateGetter(writer, field_name, return_type, [&]() {
            writer += "val o = __offset({{offset}})";
            writer +=
                "return if(o != 0) {{bbgetter}}"
                "(o + bb_pos){{ucast}} else "
                "{{field_default}}";
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.__assign(bb_pos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type,
                  [&]() { writer += "obj.__assign(bb_pos + {{offset}}, bb)"; });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = __offset(4)
              //      return if(o != 0) {
              //          obj.__assign(o + bb_pos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFun(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("o + bb_pos", fixed));
                    OffsetWrapper(
                        writer, offset_val,
                        [&]() { writer += "obj.__assign({{seek}}, bb)"; },
                        [&]() {
                          if (field.IsRequired()) {
                            writer +=
                                "throw AssertionError(\"No value for "
                                "(required) field {{field_name}}\")";
                          } else {
                            writer += "null";
                          }
                        });
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = __offset(10)
            //          return if (o != 0) {
            //              __string(o + bb_pos)
            //          } else {
            //              null
            //          }
            //     }
            // ? adds nullability annotation
            GenerateGetter(writer, field_name, return_type, [&]() {
              writer += "val o = __offset({{offset}})";
              writer += "return if (o != 0) {";
              writer.IncrementIdentLevel();
              writer += "__string(o + bb_pos)";
              writer.DecrementIdentLevel();
              writer += "} else {";
              writer.IncrementIdentLevel();
              if (field.IsRequired()) {
                writer +=
                    "throw AssertionError(\"No value for (required) field "
                    "{{field_name}}\")";
              } else {
                writer += "null";
              }
              writer.DecrementIdentLevel();
              writer += "}";
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = __offset(14)
            //     return if (o != 0) {
            //         bb.get(__vector(o) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFun(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "__vector(o) + j * " + inline_size;
              auto not_found =
                  field.IsRequired()
                      ? "throw IndexOutOfBoundsException(\"Index out of range: "
                        "$j, vector {{field_name}} is empty\")"
                      : NotFoundReturn(field.value.type.element);
              auto found = "";
              writer.SetValue("index", index);
              switch (vectortype.base_type) {
                case BASE_TYPE_STRUCT: {
                  bool fixed = vectortype.struct_def->fixed;
                  writer.SetValue("index", Indirect(index, fixed));
                  found = "obj.__assign({{index}}, bb)";
                  break;
                }
                case BASE_TYPE_UNION:
                  found = "{{bbgetter}}(obj, {{index}}){{ucast}}";
                  break;
                default: found = "{{bbgetter}}({{index}}){{ucast}}";
              }
              OffsetWrapper(
                  writer, offset_val, [&]() { writer += found; },
                  [&]() { writer += not_found; });
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFun(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += OffsetWrapperOneLine(
                      offset_val, bbgetter + "(obj, o + bb_pos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetter(writer, field_name + "Length", "Int", [&]() {
          writer += OffsetWrapperOneLine(offset_val, "__vector_len(o)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = WrapInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFun(writer, name, params, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(null, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFun(writer, name, param2, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(obj, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));
        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // val inventoryByteBuffer: ByteBuffer
        //     get =  __vector_as_bytebuffer(14, 1)

        GenerateGetterOneLine(
            writer, field_name + "AsByteBuffer", "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_as_bytebuffer({{offset}}, {{end}})";
            });

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(_bb: Bytebuffer):
        //     ByteBuffer = __vector_as_bytebuffer(_bb, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "InByteBuffer", "_bb: ByteBuffer",
            "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_in_bytebuffer(_bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = WrapInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFun(writer, nested_method_name, "obj: " + nested_type_name,
                    nested_type_name + "?", [&]() {
                      OffsetWrapper(
                          writer, offset_val,
                          [&]() {
                            writer +=
                                "obj.__assign(__indirect(__vector(o)), bb)";
                          },
                          [&]() { writer += "null"; });
                    });
      }

      // Generate mutators for scalar fields or vectors of scalars.
      if (parser_.opts.mutable_buffer) {
        auto value_type = field.value.type;
        auto underlying_type = value_base_type == BASE_TYPE_VECTOR
                                   ? value_type.VectorType()
                                   : value_type;
        auto name = namer_.LegacyKotlinMethod("mutate", field, "");
        auto size = NumToString(InlineSize(underlying_type));
        auto params = namer_.Field(field) + ": " + GenTypeGet(underlying_type);
        // A vector mutator also needs the index of the vector element it should
        // mutate.
        if (value_base_type == BASE_TYPE_VECTOR) params.insert(0, "j: Int, ");

        // Boolean parameters have to be explicitly converted to byte
        // representation.
        auto setter_parameter =
            underlying_type.base_type == BASE_TYPE_BOOL
                ? "(if(" + namer_.Field(field) + ") 1 else 0).toByte()"
                : namer_.Field(field);

        auto setter_index =
            value_base_type == BASE_TYPE_VECTOR
                ? "__vector(o) + j * " + size
                : (struct_def.fixed ? "bb_pos + " + offset_val : "o + bb_pos");
        if (IsScalar(value_base_type) ||
            (value_base_type == BASE_TYPE_VECTOR &&
             IsScalar(value_type.VectorType().base_type))) {
          auto statements = [&]() {
            writer.SetValue("bbsetter", ByteBufferSetter(underlying_type));
            writer.SetValue("index", setter_index);
            writer.SetValue("params", setter_parameter);
            writer.SetValue("cast", CastToSigned(field));
            if (struct_def.fixed) {
              writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
            } else {
              OffsetWrapper(
                  writer, offset_val,
                  [&]() {
                    writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
                    writer += "true";
                  },
                  [&]() { writer += "false"; });
            }
          };

          if (struct_def.fixed) {
            GenerateFunOneLine(writer, name, params, "ByteBuffer", statements);
          } else {
            GenerateFun(writer, name, params, "Boolean", statements);
          }
        }
      }
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare", "o1: Int, o2: Int, _bb: ByteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(__offset({{offset}}, o1, "
                  "_bb), __offset({{offset}}, o2, _bb), _bb)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "_bb", "o1");
              auto getter2 = GenLookupByKey(key_field, "_bb", "o2");
              writer += "val val_1 = " + getter1;
              writer += "val val_2 = " + getter2;
              writer += "return (val_1 - val_2).sign";
            }
          });
    }
  }